

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall FIX::ScreenLog::onIncoming(ScreenLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  string local_40;
  
  if (this->m_incoming == true) {
    Mutex::lock((Mutex *)s_mutex);
    UtcTimeStamp::setCurrent(&this->m_time);
    poVar1 = std::operator<<((ostream *)&std::cout,"<");
    UtcTimeStampConvertor::convert_abi_cxx11_
              (&local_40,(UtcTimeStampConvertor *)&this->m_time,(UtcTimeStamp *)0x9,in_ECX);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_prefix);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,"incoming>");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"  (");
    poVar1 = std::operator<<(poVar1,(string *)value);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_40);
    Mutex::unlock((Mutex *)s_mutex);
  }
  return;
}

Assistant:

void onIncoming( const std::string& value )
  {
    if ( !m_incoming ) return ;
    Locker l( s_mutex );
    m_time.setCurrent();
    std::cout << "<" << UtcTimeStampConvertor::convert(m_time, 9)
              << ", " << m_prefix
              << ", " << "incoming>" << std::endl
              << "  (" << value << ")" << std::endl;
  }